

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hacklib.c
# Opt level: O1

char * mungspaces(char *bp)

{
  char *pcVar1;
  bool bVar2;
  char *pcVar3;
  char *p2;
  char cVar4;
  bool bVar5;
  
  cVar4 = *bp;
  pcVar1 = bp;
  if (cVar4 == '\0') {
    bVar5 = true;
  }
  else {
    pcVar3 = bp + 1;
    bVar2 = true;
    do {
      if (cVar4 == '\t') {
        cVar4 = ' ';
      }
      bVar5 = cVar4 == ' ';
      if (!(bool)(bVar2 & bVar5)) {
        *pcVar1 = cVar4;
        pcVar1 = pcVar1 + 1;
      }
      cVar4 = *pcVar3;
      pcVar3 = pcVar3 + 1;
      bVar2 = bVar5;
    } while (cVar4 != '\0');
  }
  pcVar1[-(ulong)(byte)(bp < pcVar1 & bVar5)] = '\0';
  return bp;
}

Assistant:

char *mungspaces(char *bp)
{
    char c, *p, *p2;
    boolean was_space = TRUE;

    for (p = p2 = bp; (c = *p) != '\0'; p++) {
	if (c == '\t') c = ' ';
	if (c != ' ' || !was_space) *p2++ = c;
	was_space = (c == ' ');
    }
    if (was_space && p2 > bp) p2--;
    *p2 = '\0';
    return bp;
}